

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
Gudhi::Persistence_representations::Persistence_intervals::characteristic_function_of_diagram
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          Persistence_intervals *this,double x_min,double x_max,size_t number_of_bins)

{
  double dVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  ulong uVar5;
  reference pvVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_type local_88;
  size_t aa;
  size_t pos;
  size_t endIt;
  size_t beginIt;
  size_t i;
  double *local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  allocator<double> local_33;
  undefined1 local_32;
  byte local_31;
  size_t sStack_30;
  bool dbg;
  size_t number_of_bins_local;
  double x_max_local;
  double x_min_local;
  Persistence_intervals *this_local;
  vector<double,_std::allocator<double>_> *result;
  undefined1 auVar10 [16];
  
  local_31 = 0;
  local_32 = 0;
  sStack_30 = number_of_bins;
  number_of_bins_local = (size_t)x_max;
  x_max_local = x_min;
  x_min_local = (double)this;
  this_local = (Persistence_intervals *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_33);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,number_of_bins,&local_33);
  std::allocator<double>::~allocator(&local_33);
  local_50._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  local_58 = (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  i._4_4_ = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_50,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_58,(int *)((long)&i + 4));
  for (beginIt = 0;
      sVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(&this->intervals), beginIt != sVar2; beginIt = beginIt + 1) {
    if ((local_31 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::clog,"Interval : ");
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->intervals,beginIt);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->first);
      poVar3 = std::operator<<(poVar3," , ");
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->intervals,beginIt);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator[]
              (&this->intervals,beginIt);
    endIt = 0;
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,beginIt);
    if ((double)number_of_bins_local <= pvVar4->first) {
      endIt = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
    }
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,beginIt);
    if ((x_max_local < pvVar4->first) &&
       (pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](&this->intervals,beginIt),
       pvVar4->first < (double)number_of_bins_local)) {
      auVar10._8_4_ = (int)(sStack_30 >> 0x20);
      auVar10._0_8_ = sStack_30;
      auVar10._12_4_ = 0x45300000;
      uVar7 = (undefined4)sStack_30;
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->intervals,beginIt);
      dVar8 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0)) *
              (pvVar4->first - x_max_local)) / ((double)number_of_bins_local - x_max_local);
      uVar5 = (ulong)dVar8;
      endIt = uVar5 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f;
    }
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator[]
              (&this->intervals,beginIt);
    pos = 0;
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,beginIt);
    if ((double)number_of_bins_local <= pvVar4->second) {
      pos = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
    }
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&this->intervals,beginIt);
    if ((x_max_local < pvVar4->second) &&
       (pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](&this->intervals,beginIt),
       pvVar4->second < (double)number_of_bins_local)) {
      auVar11._8_4_ = (int)(sStack_30 >> 0x20);
      auVar11._0_8_ = sStack_30;
      auVar11._12_4_ = 0x45300000;
      uVar7 = (undefined4)sStack_30;
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->intervals,beginIt);
      dVar8 = (((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0)) *
              (pvVar4->second - x_max_local)) / ((double)number_of_bins_local - x_max_local);
      uVar5 = (ulong)dVar8;
      pos = uVar5 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f;
    }
    if (pos < endIt) {
      endIt = pos;
    }
    if ((local_31 & 1) != 0) {
      poVar3 = std::operator<<((ostream *)&std::clog,"beginIt : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,endIt);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::clog,"endIt : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pos);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    for (aa = endIt; aa != pos; aa = aa + 1) {
      dVar9 = (double)number_of_bins_local - x_max_local;
      auVar12._8_4_ = (int)(sStack_30 >> 0x20);
      auVar12._0_8_ = sStack_30;
      auVar12._12_4_ = 0x45300000;
      uVar7 = (undefined4)sStack_30;
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->intervals,beginIt);
      dVar8 = pvVar4->second;
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](&this->intervals,beginIt);
      dVar1 = pvVar4->first;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,aa);
      *pvVar6 = (dVar9 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0))) *
                (dVar8 - dVar1) + *pvVar6;
    }
    if ((local_31 & 1) != 0) {
      std::operator<<((ostream *)&std::clog,"Result at this stage \n");
      for (local_88 = 0;
          sVar2 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__),
          local_88 != sVar2; local_88 = local_88 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (__return_storage_ptr__,local_88);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,*pvVar6);
        std::operator<<(poVar3," ");
      }
      std::ostream::operator<<((ostream *)&std::clog,std::endl<char,std::char_traits<char>>);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Persistence_intervals::characteristic_function_of_diagram(double x_min, double x_max,
                                                                              size_t number_of_bins) const {
  bool dbg = false;

  std::vector<double> result(number_of_bins);
  std::fill(result.begin(), result.end(), 0);

  for (size_t i = 0; i != this->intervals.size(); ++i) {
    if (dbg) {
      std::clog << "Interval : " << this->intervals[i].first << " , " << this->intervals[i].second << std::endl;
    }

    size_t beginIt = 0;
    if (this->intervals[i].first < x_min) beginIt = 0;
    if (this->intervals[i].first >= x_max) beginIt = result.size();
    if ((this->intervals[i].first > x_min) && (this->intervals[i].first < x_max)) {
      beginIt = number_of_bins * (this->intervals[i].first - x_min) / (x_max - x_min);
    }

    size_t endIt = 0;
    if (this->intervals[i].second < x_min) endIt = 0;
    if (this->intervals[i].second >= x_max) endIt = result.size();
    if ((this->intervals[i].second > x_min) && (this->intervals[i].second < x_max)) {
      endIt = number_of_bins * (this->intervals[i].second - x_min) / (x_max - x_min);
    }

    if (beginIt > endIt) {
      beginIt = endIt;
    }

    if (dbg) {
      std::clog << "beginIt : " << beginIt << std::endl;
      std::clog << "endIt : " << endIt << std::endl;
    }

    for (size_t pos = beginIt; pos != endIt; ++pos) {
      result[pos] += ((x_max - x_min) / static_cast<double>(number_of_bins)) *
                     (this->intervals[i].second - this->intervals[i].first);
    }
    if (dbg) {
      std::clog << "Result at this stage \n";
      for (size_t aa = 0; aa != result.size(); ++aa) {
        std::clog << result[aa] << " ";
      }
      std::clog << std::endl;
    }
  }
  return result;
}